

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

void __thiscall
helics::ActionMessage::ActionMessage
          (ActionMessage *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _Alloc_hider _Var1;
  Message *pMVar2;
  _Alloc_hider _Var3;
  long lVar4;
  size_type *psVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined8 uStack_60;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  size_type *local_38;
  size_type local_30;
  size_type local_28 [2];
  
  this->messageAction = cmd_send_message;
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  this->messageID = pMVar2->messageID;
  this->source_id = 0;
  this->source_handle = -1700000000;
  this->dest_id = 0;
  this->dest_handle = -1700000000;
  this->counter = 0;
  this->flags = pMVar2->flags;
  this->sequenceID = 0;
  (this->actionTime).internalTimeCode = (pMVar2->time).internalTimeCode;
  (this->Te).internalTimeCode = 0;
  (this->Tdemin).internalTimeCode = 0;
  (this->Tso).internalTimeCode = 0;
  SmallBuffer::SmallBuffer(&this->payload,&pMVar2->data);
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  _Var3._M_p = (pMVar2->dest)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->dest).field_2;
  if (_Var3._M_p == _Var1._M_p) {
    local_98.field_2._M_allocated_capacity = *(undefined8 *)_Var1._M_p;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&(pMVar2->dest).field_2 + 8);
  }
  else {
    local_98.field_2._M_allocated_capacity = *(undefined8 *)_Var1._M_p;
    local_98._M_dataplus._M_p = _Var3._M_p;
  }
  local_98._M_string_length = (pMVar2->dest)._M_string_length;
  local_78 = &local_68;
  (pMVar2->dest)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->dest)._M_string_length = 0;
  (pMVar2->dest).field_2._M_local_buf[0] = '\0';
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  _Var3._M_p = (pMVar2->source)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->source).field_2;
  if (_Var3._M_p == _Var1._M_p) {
    local_68 = *(size_type *)_Var1._M_p;
    uStack_60 = *(undefined8 *)((long)&(pMVar2->source).field_2 + 8);
  }
  else {
    local_68 = *(size_type *)_Var1._M_p;
    local_78 = (size_type *)_Var3._M_p;
  }
  local_70 = (pMVar2->source)._M_string_length;
  local_58 = &local_48;
  (pMVar2->source)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->source)._M_string_length = 0;
  (pMVar2->source).field_2._M_local_buf[0] = '\0';
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  _Var3._M_p = (pMVar2->original_source)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->original_source).field_2;
  if (_Var3._M_p == _Var1._M_p) {
    local_48 = *(size_type *)_Var1._M_p;
    uStack_40 = *(undefined8 *)((long)&(pMVar2->original_source).field_2 + 8);
  }
  else {
    local_48 = *(size_type *)_Var1._M_p;
    local_58 = (size_type *)_Var3._M_p;
  }
  local_50 = (pMVar2->original_source)._M_string_length;
  psVar5 = local_28;
  (pMVar2->original_source)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->original_source)._M_string_length = 0;
  (pMVar2->original_source).field_2._M_local_buf[0] = '\0';
  pMVar2 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_38 = (size_type *)(pMVar2->original_dest)._M_dataplus._M_p;
  _Var1._M_p = (pointer)&(pMVar2->original_dest).field_2;
  if (local_38 == (size_type *)_Var1._M_p) {
    local_28[0] = *(size_type *)_Var1._M_p;
    local_28[1] = *(undefined8 *)((long)&(pMVar2->original_dest).field_2 + 8);
    local_38 = psVar5;
  }
  else {
    local_28[0] = *(size_type *)_Var1._M_p;
  }
  local_30 = (pMVar2->original_dest)._M_string_length;
  (pMVar2->original_dest)._M_dataplus._M_p = _Var1._M_p;
  (pMVar2->original_dest)._M_string_length = 0;
  (pMVar2->original_dest).field_2._M_local_buf[0] = '\0';
  __l._M_len = 4;
  __l._M_array = &local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->stringData,__l,&local_99);
  lVar4 = -0x80;
  do {
    if (psVar5 != (size_type *)psVar5[-2]) {
      operator_delete((size_type *)psVar5[-2],*psVar5 + 1);
    }
    psVar5 = psVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  return;
}

Assistant:

ActionMessage::ActionMessage(std::unique_ptr<Message> message):
    messageAction(CMD_SEND_MESSAGE), messageID(message->messageID), flags(message->flags),
    actionTime(message->time), payload(std::move(message->data)),
    stringData({std::move(message->dest),
                std::move(message->source),
                std::move(message->original_source),
                std::move(message->original_dest)})
{
}